

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_name.c
# Opt level: O1

ares_status_t
ares_dns_name_write(ares_buf_t *buf,ares_llist_t **list,ares_bool_t validate_hostname,char *name)

{
  ulong uVar1;
  ares_llist_t **ppaVar2;
  ares_bool_t aVar3;
  ares_status_t aVar4;
  ares_status_t aVar5;
  uint uVar6;
  ares_array_t *paVar7;
  size_t sVar8;
  ares_llist_node_t *paVar9;
  undefined8 *puVar10;
  ares_buf_t *paVar11;
  undefined8 *puVar12;
  uchar *data;
  size_t sVar13;
  ares_llist_t *paVar14;
  char *pcVar15;
  long lVar16;
  ares_buf_t *paVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  uchar c;
  char name_copy [512];
  byte local_28d;
  ares_bool_t local_28c;
  size_t local_288;
  ulong local_280;
  ares_buf_t *local_278;
  ulong local_270;
  ares_llist_t **local_268;
  ares_buf_t *local_260;
  ares_array_t *local_258;
  undefined8 *local_250;
  char *local_248;
  undefined8 local_240;
  uchar local_238 [520];
  
  local_240 = ares_buf_len(buf);
  if (name == (char *)0x0 || buf == (ares_buf_t *)0x0) {
    return ARES_EFORMERR;
  }
  local_248 = name;
  paVar7 = ares_array_create(8,ares_dns_labels_free_cb);
  if (paVar7 == (ares_array_t *)0x0) {
    return ARES_ENOMEM;
  }
  local_280 = ares_strcpy((char *)local_238,local_248,0x200);
  local_270 = local_280;
  local_268 = list;
  if (list == (ares_llist_t **)0x0) {
    puVar12 = (undefined8 *)0x0;
  }
  else {
    paVar14 = *list;
    sVar8 = ares_strlen((char *)local_238);
    local_28c = validate_hostname;
    local_260 = buf;
    local_258 = paVar7;
    if ((sVar8 == 0 || paVar14 == (ares_llist_t *)0x0) ||
       (paVar9 = ares_llist_node_first(paVar14), paVar9 == (ares_llist_node_t *)0x0)) {
      puVar12 = (undefined8 *)0x0;
    }
    else {
      puVar12 = (undefined8 *)0x0;
      do {
        puVar10 = (undefined8 *)ares_llist_node_val(paVar9);
        uVar1 = puVar10[1];
        if ((uVar1 <= sVar8) &&
           ((((puVar12 == (undefined8 *)0x0 || ((ulong)puVar12[1] <= uVar1)) &&
             (aVar3 = ares_streq((char *)*puVar10,(char *)(local_238 + (sVar8 - uVar1))),
             aVar3 != ARES_FALSE)) && ((sVar8 == uVar1 || (local_238[(sVar8 - uVar1) + -1] == '.')))
            ))) {
          puVar12 = puVar10;
        }
        paVar9 = ares_llist_node_next(paVar9);
      } while (paVar9 != (ares_llist_node_t *)0x0);
    }
    paVar7 = local_258;
    buf = local_260;
    validate_hostname = local_28c;
    if (puVar12 == (undefined8 *)0x0) {
      puVar12 = (undefined8 *)0x0;
      local_280 = local_270;
    }
    else {
      local_280 = local_270;
      if (puVar12[1] != local_270) {
        local_280 = ~puVar12[1] + local_270;
        local_238[local_280] = '\0';
      }
    }
  }
  if ((puVar12 == (undefined8 *)0x0) || (puVar12[1] != local_270)) {
    local_250 = puVar12;
    paVar11 = ares_buf_create();
    if (paVar11 != (ares_buf_t *)0x0) {
      if (local_238[0] != '\0') {
        sVar8 = ares_strlen((char *)local_238);
        aVar4 = ares_buf_append(paVar11,local_238,sVar8);
        if (aVar4 != ARES_SUCCESS) goto LAB_00120ce2;
      }
      local_278 = ares_dns_labels_add(paVar7);
      aVar3 = validate_hostname;
      if (local_278 != (ares_buf_t *)0x0) {
        do {
          while( true ) {
            local_28c = aVar3;
            aVar4 = ares_buf_fetch_bytes(paVar11,&local_28d,1);
            if (aVar4 != ARES_SUCCESS) {
              puVar12 = (undefined8 *)ares_array_last(paVar7);
              if (puVar12 == (undefined8 *)0x0) {
                paVar17 = (ares_buf_t *)0x0;
              }
              else {
                paVar17 = (ares_buf_t *)*puVar12;
              }
              sVar8 = ares_buf_len(paVar17);
              if (sVar8 == 0) {
                ares_array_remove_last(paVar7);
              }
              sVar8 = ares_array_len(paVar7);
              if (sVar8 == 1) {
                puVar12 = (undefined8 *)ares_array_last(paVar7);
                if (puVar12 == (undefined8 *)0x0) {
                  paVar17 = (ares_buf_t *)0x0;
                }
                else {
                  paVar17 = (ares_buf_t *)*puVar12;
                }
                sVar8 = ares_buf_len(paVar17);
                if (sVar8 == 0) {
                  ares_array_remove_last(paVar7);
                }
              }
              sVar8 = ares_array_len(paVar7);
              if (sVar8 == 0) {
                lVar16 = -0x101;
                goto LAB_00120fa8;
              }
              lVar16 = 0;
              sVar8 = 0;
              goto LAB_00120f52;
            }
            if (local_28d == 0x5c) break;
            if (local_28d == 0x2e) {
              local_278 = ares_dns_labels_add(paVar7);
              aVar3 = local_28c;
              if (local_278 == (ares_buf_t *)0x0) goto LAB_00120cdc;
            }
            else {
              if (((validate_hostname != ARES_FALSE) && (9 < (byte)(local_28d - 0x30))) &&
                 (0x19 < (byte)((local_28d & 0xdf) + 0xbf))) {
                aVar4 = ARES_EBADNAME;
                if ((0x35 < local_28d - 0x2a) ||
                   ((0x20000000000029U >> ((ulong)(local_28d - 0x2a) & 0x3f) & 1) == 0))
                goto LAB_00120ce2;
              }
              aVar4 = ares_buf_append_byte(local_278,local_28d);
              aVar3 = local_28c;
              if (aVar4 != ARES_SUCCESS) goto LAB_00120ce2;
            }
          }
          aVar5 = ares_buf_fetch_bytes(paVar11,(uchar *)&local_288,1);
          aVar4 = ARES_EBADNAME;
          if (aVar5 == ARES_SUCCESS) {
            uVar18 = (uint)(byte)local_288;
            if ((byte)((byte)local_288 - 0x30) < 10) {
              uVar18 = (byte)local_288 - 0x30;
              lVar16 = 1;
              do {
                aVar5 = ares_buf_fetch_bytes(paVar11,(uchar *)&local_288,1);
                if ((aVar5 != ARES_SUCCESS) || (9 < (byte)((byte)local_288 - 0x30)))
                goto LAB_00120cb2;
                iVar19 = (uint)(byte)local_288 + uVar18 * 10;
                uVar18 = iVar19 - 0x30;
                lVar16 = lVar16 + -1;
              } while (lVar16 == 0);
              if (0xff < uVar18) goto LAB_00120cb2;
              if ((((9 < iVar19 - 0x60U) && (local_28c != ARES_FALSE)) && (0x19 < iVar19 - 0x91U))
                 && (0x19 < iVar19 - 0x71U)) goto LAB_00120c85;
            }
            else if ((local_28c != ARES_FALSE) && (0x19 < (byte)(((byte)local_288 & 0xdf) + 0xbf)))
            {
LAB_00120c85:
              uVar6 = (uVar18 & 0xff) - 0x2a;
              if ((0x35 < uVar6) || ((0x20000000000039U >> ((ulong)uVar6 & 0x3f) & 1) == 0))
              goto LAB_00120cb2;
            }
            aVar4 = ares_buf_append_byte(local_278,(uchar)uVar18);
          }
LAB_00120cb2:
          validate_hostname = local_28c;
          aVar3 = local_28c;
        } while (aVar4 == ARES_SUCCESS);
        goto LAB_00120ce2;
      }
    }
LAB_00120cdc:
    aVar4 = ARES_ENOMEM;
    goto LAB_00120ce2;
  }
  goto LAB_00120dd5;
  while( true ) {
    lVar16 = lVar16 + sVar13;
    sVar8 = sVar8 + 1;
    sVar13 = ares_array_len(paVar7);
    if (sVar13 <= sVar8) break;
LAB_00120f52:
    puVar12 = (undefined8 *)ares_array_at(paVar7,sVar8);
    if (puVar12 == (undefined8 *)0x0) {
      paVar17 = (ares_buf_t *)0x0;
    }
    else {
      paVar17 = (ares_buf_t *)*puVar12;
    }
    sVar13 = ares_buf_len(paVar17);
    if (sVar13 - 0x40 < 0xffffffffffffffc1) {
      aVar4 = ARES_EBADNAME;
      goto LAB_00120ce2;
    }
  }
  lVar16 = lVar16 + -0x101;
LAB_00120fa8:
  sVar8 = ares_array_len(paVar7);
  if (sVar8 != 0) {
    sVar8 = ares_array_len(paVar7);
    aVar4 = ARES_EBADNAME;
    if (sVar8 + lVar16 < 0xffffffffffffff00) goto LAB_00120ce2;
  }
  aVar4 = ARES_SUCCESS;
LAB_00120ce2:
  ares_buf_destroy(paVar11);
  bVar21 = true;
  if (aVar4 == ARES_SUCCESS) {
    sVar8 = ares_array_len(paVar7);
    aVar4 = ARES_SUCCESS;
    if (sVar8 != 0) {
      sVar8 = 0;
      do {
        local_288 = 0;
        puVar12 = (undefined8 *)ares_array_at(paVar7,sVar8);
        if (puVar12 == (undefined8 *)0x0) {
          paVar11 = (ares_buf_t *)0x0;
        }
        else {
          paVar11 = (ares_buf_t *)*puVar12;
        }
        data = ares_buf_peek(paVar11,&local_288);
        aVar4 = ares_buf_append_byte(buf,(byte)local_288);
        if (aVar4 == ARES_SUCCESS) {
          aVar4 = ares_buf_append(buf,data,local_288);
          bVar20 = aVar4 == ARES_SUCCESS;
          bVar21 = !bVar20;
        }
        else {
          bVar21 = true;
          bVar20 = false;
        }
        if (!bVar20) goto LAB_00120db5;
        sVar8 = sVar8 + 1;
        sVar13 = ares_array_len(paVar7);
      } while (sVar8 < sVar13);
    }
    bVar21 = false;
    if (local_250 == (undefined8 *)0x0) {
      aVar4 = ares_buf_append_byte(buf,'\0');
      bVar21 = aVar4 != ARES_SUCCESS;
    }
  }
LAB_00120db5:
  if (bVar21) goto LAB_00120ff4;
  puVar12 = local_250;
  if (bVar21) {
    return aVar4;
  }
LAB_00120dd5:
  ppaVar2 = local_268;
  uVar1 = local_270;
  if ((puVar12 != (undefined8 *)0x0) &&
     (aVar4 = ares_buf_append_be16(buf,*(ushort *)(puVar12 + 2) | 0xc000), aVar4 != ARES_SUCCESS))
  goto LAB_00120ff4;
  pcVar15 = local_248;
  if (ppaVar2 != (ares_llist_t **)0x0) {
    if (puVar12 == (undefined8 *)0x0) {
      if (local_280 != 0) goto LAB_00120e4e;
    }
    else if ((local_280 != 0) && (puVar12[1] != uVar1)) {
LAB_00120e4e:
      sVar8 = ares_strlen(local_248);
      aVar4 = ARES_EFORMERR;
      if ((sVar8 == 0) || (sVar8 = ares_strlen(pcVar15), 0xff < sVar8)) {
LAB_00120feb:
        bVar21 = false;
      }
      else {
        if (*ppaVar2 == (ares_llist_t *)0x0) {
          paVar14 = ares_llist_create(ares_nameoffset_free);
          *ppaVar2 = paVar14;
        }
        if (*ppaVar2 == (ares_llist_t *)0x0) {
          puVar12 = (undefined8 *)0x0;
LAB_00120fdd:
          ares_nameoffset_free(puVar12);
LAB_00120fe5:
          aVar4 = ARES_ENOMEM;
          goto LAB_00120feb;
        }
        puVar12 = (undefined8 *)ares_malloc_zero(0x18);
        aVar4 = ARES_SUCCESS;
        if (puVar12 == (undefined8 *)0x0) goto LAB_00120fe5;
        pcVar15 = ares_strdup(pcVar15);
        *puVar12 = pcVar15;
        sVar8 = ares_strlen(pcVar15);
        puVar12[1] = sVar8;
        puVar12[2] = local_240;
        paVar9 = ares_llist_insert_last(*ppaVar2,puVar12);
        bVar21 = true;
        if (paVar9 == (ares_llist_node_t *)0x0) goto LAB_00120fdd;
      }
      if (!bVar21) goto LAB_00120ff4;
    }
  }
  aVar4 = ARES_SUCCESS;
LAB_00120ff4:
  ares_array_destroy(paVar7);
  return aVar4;
}

Assistant:

ares_status_t ares_dns_name_write(ares_buf_t *buf, ares_llist_t **list,
                                  ares_bool_t validate_hostname,
                                  const char *name)
{
  const ares_nameoffset_t *off = NULL;
  size_t                   name_len;
  size_t                   orig_name_len;
  size_t                   pos    = ares_buf_len(buf);
  ares_array_t            *labels = NULL;
  char                     name_copy[512];
  ares_status_t            status;

  if (buf == NULL || name == NULL) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  labels = ares_array_create(sizeof(ares_buf_t *), ares_dns_labels_free_cb);
  if (labels == NULL) {
    return ARES_ENOMEM;
  }

  /* NOTE: due to possible escaping, name_copy buffer is > 256 to allow for
   *       this */
  name_len      = ares_strcpy(name_copy, name, sizeof(name_copy));
  orig_name_len = name_len;

  /* Find longest match */
  if (list != NULL) {
    off = ares_nameoffset_find(*list, name_copy);
    if (off != NULL && off->name_len != name_len) {
      /* truncate */
      name_len            -= (off->name_len + 1);
      name_copy[name_len]  = 0;
    }
  }

  /* Output labels */
  if (off == NULL || off->name_len != orig_name_len) {
    size_t i;

    status = ares_split_dns_name(labels, validate_hostname, name_copy);
    if (status != ARES_SUCCESS) {
      goto done;
    }

    for (i = 0; i < ares_array_len(labels); i++) {
      size_t               len  = 0;
      const ares_buf_t    *lbuf = ares_dns_labels_get_at(labels, i);
      const unsigned char *ptr  = ares_buf_peek(lbuf, &len);

      status = ares_buf_append_byte(buf, (unsigned char)(len & 0xFF));
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }

      status = ares_buf_append(buf, ptr, len);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }

    /* If we are NOT jumping to another label, output terminator */
    if (off == NULL) {
      status = ares_buf_append_byte(buf, 0);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }
  }

  /* Output name compression offset jump */
  if (off != NULL) {
    unsigned short u16 =
      (unsigned short)0xC000 | (unsigned short)(off->idx & 0x3FFF);
    status = ares_buf_append_be16(buf, u16);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  /* Store pointer for future jumps as long as its not an exact match for
   * a prior entry */
  if (list != NULL && (off == NULL || off->name_len != orig_name_len) &&
      name_len > 0) {
    status = ares_nameoffset_create(list, name /* not truncated copy! */, pos);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(labels);
  return status;
}